

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.cpp
# Opt level: O2

void __thiscall
OpenMD::HydroIO::interpretHydroProp
          (HydroIO *this,HydroProp *hp,RealType viscosity,RealType temperature)

{
  ostream *poVar1;
  Vector3d cod;
  Vector<double,_3U> local_9c0;
  Vector<double,_3U> local_9a8;
  Vector3d ror;
  Mat3x3d Ddtr;
  Mat3x3d Ddrr;
  Mat3x3d Ddtt;
  Mat3x3d Xidrr;
  Mat3x3d Xidtr;
  Mat3x3d Xidrt;
  Mat3x3d Xidtt;
  Mat3x3d Xirtr;
  RectMatrix<double,_3U,_3U> local_738;
  Mat3x3d Ddrt;
  Mat3x3d Drrr;
  Mat3x3d Drtr;
  Mat3x3d Drrt;
  Mat3x3d Drtt;
  Mat6x6d Xid;
  Mat3x3d Xirrr;
  Mat3x3d Xirtt;
  Mat6x6d Dd;
  Mat3x3d Xirrt;
  Mat6x6d Dr;
  Mat6x6d Xi;
  
  Vector<double,_3U>::Vector(&ror.super_Vector<double,_3U>,&(hp->cor_).super_Vector<double,_3U>);
  SquareMatrix<double,_6>::SquareMatrix((SquareMatrix<double,_6> *)&Xi);
  RectMatrix<double,_6U,_6U>::operator=
            (&Dr.super_RectMatrix<double,_6U,_6U>,&(hp->Xi_).super_RectMatrix<double,_6U,_6U>);
  RectMatrix<double,_6U,_6U>::operator=
            ((RectMatrix<double,_6U,_6U> *)&Xi,&Dr.super_RectMatrix<double,_6U,_6U>);
  SquareMatrix<double,_3>::SquareMatrix(&Xirtt.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Xirrt.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Xirtr.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Xirrr.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Xi,0,0,
             (SquareMatrix3<double> *)&Xirtt.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Xi,0,3,
             (SquareMatrix3<double> *)&Xirrt.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Xi,3,0,
             (SquareMatrix3<double> *)&Xirtr.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Xi,3,3,
             (SquareMatrix3<double> *)&Xirrr.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_6>::SquareMatrix((SquareMatrix<double,_6> *)&Dr);
  HydroProp::getDiffusionTensor((Mat6x6d *)&Xid.super_RectMatrix<double,_6U,_6U>,hp,temperature);
  RectMatrix<double,_6U,_6U>::operator=
            ((RectMatrix<double,_6U,_6U> *)&Dr,&Xid.super_RectMatrix<double,_6U,_6U>);
  SquareMatrix<double,_3>::SquareMatrix(&Drtt.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Drrt.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Drtr.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Drrr.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Dr,0,0,
             (SquareMatrix3<double> *)&Drtt.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Dr,0,3,
             (SquareMatrix3<double> *)&Drrt.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Dr,3,0,
             (SquareMatrix3<double> *)&Drtr.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Dr,3,3,
             (SquareMatrix3<double> *)&Drrr.super_SquareMatrix<double,_3>);
  std::operator<<((ostream *)&std::cout,"\n");
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n");
  std::operator<<((ostream *)&std::cout,"viscosity = ");
  poVar1 = std::ostream::_M_insert<double>(viscosity);
  poVar1 = std::operator<<(poVar1," Poise");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"temperature = ");
  poVar1 = std::ostream::_M_insert<double>(temperature);
  poVar1 = std::operator<<(poVar1," K");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n");
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "The centers are based on the elements generated by Hydro ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"which have been placed in an .xyz or .stl file.");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "They are not based on the geometry in the .omd file.\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Center of resistance :");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,&ror.super_Vector<double,_3U>);
  poVar1 = std::operator<<(poVar1,"\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Resistance tensor at center of resistance\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation [kcal.fs/(mol.A^2)]:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Xirtt);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation-translation [kcal.fs/(mol.A.radian)]:");
  std::endl<char,std::char_traits<char>>(poVar1);
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&Xid,&Xirtr);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Xid);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation-rotation [kcal.fs/(mol.A.radian)]:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Xirtr);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation [kcal.fs/(mol.radian^2)]:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Xirrr);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Diffusion tensor at center of resistance\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation (A^2 / fs):");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Drtt);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation-translation (A.radian / fs):");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Drrt);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation-rotation (A.radian / fs):");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Drtr);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation (radian^2 / fs):");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Drrr);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  HydroProp::getCenterOfDiffusion(&cod,hp,temperature);
  Vector<double,_3U>::Vector(&local_9a8,&cod.super_Vector<double,_3U>);
  HydroProp::getResistanceTensorAtPos(&Xid,hp,(Vector3d *)&local_9a8);
  SquareMatrix<double,_3>::SquareMatrix(&Xidtt.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Xidrt.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Xidtr.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Xidrr.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Xid,0,0,&Xidtt);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Xid,0,3,&Xidrt);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Xid,3,0,&Xidtr);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Xid,3,3,&Xidrr);
  Vector<double,_3U>::Vector(&local_9c0,&cod.super_Vector<double,_3U>);
  HydroProp::getDiffusionTensorAtPos(&Dd,hp,(Vector3d *)&local_9c0,temperature);
  SquareMatrix<double,_3>::SquareMatrix(&Ddtt.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Ddtr.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Ddrt.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Ddrr.super_SquareMatrix<double,_3>);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Dd,0,0,&Ddtt);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Dd,0,3,&Ddrt);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Dd,3,0,&Ddtr);
  RectMatrix<double,6u,6u>::getSubMatrix<OpenMD::SquareMatrix3<double>>
            ((RectMatrix<double,6u,6u> *)&Dd,3,3,&Ddrr);
  poVar1 = std::operator<<((ostream *)&std::cout,"Center of diffusion: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,&cod.super_Vector<double,_3U>);
  poVar1 = std::operator<<(poVar1,"\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Diffusion tensor at center of diffusion \n ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation (A^2 / fs) :");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Ddtt);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation-translation (A.radian / fs):");
  std::endl<char,std::char_traits<char>>(poVar1);
  SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_738,&Ddtr);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,&local_738);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation-rotation (A.radian / fs):");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Ddtr);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation (radian^2 / fs):");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Ddrr);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Resistance tensor at center of diffusion \n ");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation [kcal.fs/(mol.A^2)]:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Xidtt);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation-translation [kcal.fs/(mol.A.radian)]:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Xidrt);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"translation-rotation [kcal.fs/(mol.A.radian)]:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Xidtr);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"rotation [kcal.fs/(mol.radian^2)]:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = OpenMD::operator<<((ostream *)&std::cout,(RectMatrix<double,_3U,_3U> *)&Xidrr);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"-----------------------------------------\n\n");
  return;
}

Assistant:

void HydroIO::interpretHydroProp(HydroProp* hp, RealType viscosity,
                                   RealType temperature) {
    Vector3d ror = hp->getCenterOfResistance();

    Mat6x6d Xi;
    Xi = hp->getResistanceTensor();
    Mat3x3d Xirtt;
    Mat3x3d Xirrt;
    Mat3x3d Xirtr;
    Mat3x3d Xirrr;

    Xi.getSubMatrix(0, 0, Xirtt);
    Xi.getSubMatrix(0, 3, Xirrt);
    Xi.getSubMatrix(3, 0, Xirtr);
    Xi.getSubMatrix(3, 3, Xirrr);

    Mat6x6d Dr;
    Dr = hp->getDiffusionTensor(temperature);

    Mat3x3d Drtt;
    Mat3x3d Drrt;
    Mat3x3d Drtr;
    Mat3x3d Drrr;

    Dr.getSubMatrix(0, 0, Drtt);
    Dr.getSubMatrix(0, 3, Drrt);
    Dr.getSubMatrix(3, 0, Drtr);
    Dr.getSubMatrix(3, 3, Drrr);

    std::cout << "\n";
    std::cout << "-----------------------------------------\n";
    std::cout << "viscosity = " << viscosity << " Poise" << std::endl;
    std::cout << "temperature = " << temperature << " K" << std::endl;
    std::cout << "-----------------------------------------\n";
    std::cout << "The centers are based on the elements generated by Hydro "
              << std::endl;
    std::cout << "which have been placed in an .xyz or .stl file." << std::endl;
    std::cout << "They are not based on the geometry in the .omd file.\n"
              << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Center of resistance :" << std::endl;
    std::cout << ror << "\n" << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Resistance tensor at center of resistance\n" << std::endl;
    std::cout << "translation [kcal.fs/(mol.A^2)]:" << std::endl;
    std::cout << Xirtt << std::endl;
    std::cout << "rotation-translation [kcal.fs/(mol.A.radian)]:" << std::endl;
    std::cout << Xirtr.transpose() << std::endl;
    std::cout << "translation-rotation [kcal.fs/(mol.A.radian)]:" << std::endl;
    std::cout << Xirtr << std::endl;
    std::cout << "rotation [kcal.fs/(mol.radian^2)]:" << std::endl;
    std::cout << Xirrr << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Diffusion tensor at center of resistance\n" << std::endl;
    std::cout << "translation (A^2 / fs):" << std::endl;
    std::cout << Drtt << std::endl;
    std::cout << "rotation-translation (A.radian / fs):" << std::endl;
    std::cout << Drrt << std::endl;
    std::cout << "translation-rotation (A.radian / fs):" << std::endl;
    std::cout << Drtr << std::endl;
    std::cout << "rotation (radian^2 / fs):" << std::endl;
    std::cout << Drrr << std::endl;
    std::cout << "-----------------------------------------\n\n";

    // calculate center of diffusion using the same arbitrary origin as above
    // (from the generated geometry file .xyz)

    Vector3d cod = hp->getCenterOfDiffusion(temperature);
    Mat6x6d Xid  = hp->getResistanceTensorAtPos(cod);

    Mat3x3d Xidtt;
    Mat3x3d Xidrt;
    Mat3x3d Xidtr;
    Mat3x3d Xidrr;

    Xid.getSubMatrix(0, 0, Xidtt);
    Xid.getSubMatrix(0, 3, Xidrt);
    Xid.getSubMatrix(3, 0, Xidtr);
    Xid.getSubMatrix(3, 3, Xidrr);

    // calculate Diffusion Tensor at center of diffusion
    Mat6x6d Dd = hp->getDiffusionTensorAtPos(cod, temperature);

    Mat3x3d Ddtt;
    Mat3x3d Ddtr;
    Mat3x3d Ddrt;
    Mat3x3d Ddrr;

    Dd.getSubMatrix(0, 0, Ddtt);
    Dd.getSubMatrix(0, 3, Ddrt);
    Dd.getSubMatrix(3, 0, Ddtr);
    Dd.getSubMatrix(3, 3, Ddrr);

    std::cout << "Center of diffusion: " << std::endl;
    std::cout << cod << "\n" << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Diffusion tensor at center of diffusion \n " << std::endl;
    std::cout << "translation (A^2 / fs) :" << std::endl;
    std::cout << Ddtt << std::endl;
    std::cout << "rotation-translation (A.radian / fs):" << std::endl;
    std::cout << Ddtr.transpose() << std::endl;
    std::cout << "translation-rotation (A.radian / fs):" << std::endl;
    std::cout << Ddtr << std::endl;
    std::cout << "rotation (radian^2 / fs):" << std::endl;
    std::cout << Ddrr << std::endl;
    std::cout << "-----------------------------------------\n\n";
    std::cout << "Resistance tensor at center of diffusion \n " << std::endl;
    std::cout << "translation [kcal.fs/(mol.A^2)]:" << std::endl;
    std::cout << Xidtt << std::endl;
    std::cout << "rotation-translation [kcal.fs/(mol.A.radian)]:" << std::endl;
    std::cout << Xidrt << std::endl;
    std::cout << "translation-rotation [kcal.fs/(mol.A.radian)]:" << std::endl;
    std::cout << Xidtr << std::endl;
    std::cout << "rotation [kcal.fs/(mol.radian^2)]:" << std::endl;
    std::cout << Xidrr << std::endl;
    std::cout << "-----------------------------------------\n\n";
  }